

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

int64_t mipsdsp_mul_q31_q31(int32_t ac,uint32_t a,uint32_t b,CPUMIPSState_conflict5 *env)

{
  target_ulong *ptVar1;
  
  if (b == 0x80000000 && a == 0x80000000) {
    ptVar1 = &(env->active_tc).DSPControl;
    *ptVar1 = *ptVar1 | 1L << ((char)ac + 0x10U & 0x3f);
    return 0x7fffffffffffffff;
  }
  return (long)(int)b * (long)(int)a * 2;
}

Assistant:

static inline int64_t mipsdsp_mul_q31_q31(int32_t ac, uint32_t a, uint32_t b,
                                          CPUMIPSState *env)
{
    uint64_t temp;

    if ((a == 0x80000000) && (b == 0x80000000)) {
        temp = (0x01ull << 63) - 1;
        set_DSPControl_overflow_flag(1, 16 + ac, env);
    } else {
        temp = ((int64_t)(int32_t)a * (int32_t)b) << 1;
    }

    return temp;
}